

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar_vector.hpp
# Opt level: O0

void __thiscall
cfgfile::tag_scalar_vector_t<int,_cfgfile::string_trait_t>::set_value
          (tag_scalar_vector_t<int,_cfgfile::string_trait_t> *this,int *v)

{
  long *plVar1;
  ulong uVar2;
  exception_t<cfgfile::string_trait_t> *this_00;
  undefined8 in_RSI;
  tag_t<cfgfile::string_trait_t> *in_RDI;
  string *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  value_type_conflict1 *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_149 [10];
  
  if ((in_RDI[1].m_name.field_2._M_allocated_capacity != 0) &&
     (plVar1 = *(long **)&in_RDI[1].m_name.field_2,
     uVar2 = (**(code **)(*plVar1 + 0x10))(plVar1,in_RSI), (uVar2 & 1) == 0)) {
    this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
               (allocator<char> *)in_stack_fffffffffffffe70);
    string_trait_t::from_ascii(in_stack_fffffffffffffe38);
    format_t<int,cfgfile::string_trait_t>::to_string_abi_cxx11_((int *)in_stack_fffffffffffffe38);
    std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    __lhs = local_149;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
               (allocator<char> *)in_stack_fffffffffffffe70);
    string_trait_t::from_ascii(in_stack_fffffffffffffe38);
    std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
    std::operator+(__lhs,in_stack_fffffffffffffe40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
               (allocator<char> *)in_stack_fffffffffffffe70);
    string_trait_t::from_ascii(in_stack_fffffffffffffe38);
    std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    exception_t<cfgfile::string_trait_t>::exception_t(this_00,__lhs);
    __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  tag_t<cfgfile::string_trait_t>::set_defined(in_RDI,true);
  return;
}

Assistant:

void
	set_value( const T & v )
	{
		if( m_constraint )
		{
			if( !m_constraint->check( v ) )
				throw exception_t< Trait >(
					Trait::from_ascii( "Invalid value: \"" ) +
					typename Trait::string_t(
						format_t< T, Trait >::to_string( v ) ) +
					Trait::from_ascii( "\". Value must match to the "
						"constraint in tag \"" ) +
					this->name() + Trait::from_ascii( "\"." ) );
		}

		m_values.push_back( v );

		this->set_defined();
	}